

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O2

void __thiscall
ktx::DiffComplex<KVEntryUint32>::printJson
          (DiffComplex<KVEntryUint32> *this,size_t index,PrintIndent *out,int indent,char *space,
          char *nl)

{
  undefined4 in_register_0000000c;
  string local_30;
  
  if (*(int *)((long)&this->values[index].super__Optional_base<KVEntryUint32,_false,_false>.
                      _M_payload.super__Optional_payload<KVEntryUint32,_true,_false,_false>.
                      super__Optional_payload_base<KVEntryUint32>._M_payload + 0x10) == 4) {
    local_30._M_dataplus._M_p._0_4_ =
         *(undefined4 *)
          *(char **)((long)&this->values[index].super__Optional_base<KVEntryUint32,_false,_false>.
                            _M_payload.super__Optional_payload<KVEntryUint32,_true,_false,_false>.
                            super__Optional_payload_base<KVEntryUint32>._M_payload._M_value.
                            super_KVEntry + 8);
    PrintIndent::operator()(out,3,(char (*) [3])0x1dcb84,(uint *)&local_30);
  }
  else {
    KVEntry::extractRawBytes_abi_cxx11_
              (&local_30,(KVEntry *)(this->values + index),false,
               (char *)CONCAT44(in_register_0000000c,indent));
    PrintIndent::operator()(out,3,(char (*) [3])0x1dcb84,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void printJson(std::size_t index, PrintIndent& out, int indent, const char* space, const char* nl) const {
        values[index]->printJson(out, indent, space, nl);
    }